

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::WriteToFile(QueryProfiler *this,char *path,string *info)

{
  IOException *this_00;
  int *piVar1;
  char *pcVar2;
  allocator local_239;
  string local_238;
  ofstream out;
  byte abStack_1f8 [480];
  
  ::std::ofstream::ofstream((ostream *)&out,path,_S_out);
  ::std::operator<<((ostream *)&out,(string *)info);
  ::std::ofstream::close();
  if ((abStack_1f8[*(long *)(_out + -0x18)] & 5) == 0) {
    ::std::ofstream::~ofstream(&out);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  ::std::__cxx11::string::string((string *)&local_238,pcVar2,&local_239);
  IOException::IOException(this_00,&local_238);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void QueryProfiler::WriteToFile(const char *path, string &info) const {
	ofstream out(path);
	out << info;
	out.close();
	// throw an IO exception if it fails to write the file
	if (out.fail()) {
		throw IOException(strerror(errno));
	}
}